

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directives.cpp
# Opt level: O2

void dirEMPTYTRD(void)

{
  char cVar1;
  bool bVar2;
  size_t __n;
  char diskLabel [9];
  string srcLabel;
  path fnaam;
  
  if (pass == 3) {
    builtin_strncpy(diskLabel,"        ",9);
    GetOutputFileName_abi_cxx11_(&fnaam,&lp);
    cVar1 = std::filesystem::__cxx11::path::has_filename();
    if (cVar1 == '\0') {
      Error("[EMPTYTRD] Syntax error",bp,IF_FIRST);
    }
    else {
      bVar2 = anyComma(&lp);
      if (bVar2) {
        GetDelimitedString_abi_cxx11_(&srcLabel,&lp);
        if (srcLabel._M_string_length == 0) {
          Error("[EMPTYTRD] Syntax error, empty label",bp,IF_FIRST);
        }
        else {
          __n = 8;
          if (srcLabel._M_string_length < 8) {
            __n = srcLabel._M_string_length;
          }
          memcpy(diskLabel,srcLabel._M_dataplus._M_p,__n);
          if (8 < srcLabel._M_string_length) {
            Warning("[EMPTYTRD] label will be truncated to 8 characters",diskLabel,W_PASS3);
          }
        }
        std::__cxx11::string::~string((string *)&srcLabel);
      }
      TRD_SaveEmpty(&fnaam,diskLabel);
    }
    std::filesystem::__cxx11::path::~path(&fnaam);
    return;
  }
  SkipToEol(&lp);
  return;
}

Assistant:

static void dirEMPTYTRD() {
	if (pass != LASTPASS) {
		SkipToEol(lp);
		return;
	}
	char diskLabel[9] = "        ";

	const std::filesystem::path fnaam = GetOutputFileName(lp);
	if (!fnaam.has_filename()) {
		Error("[EMPTYTRD] Syntax error", bp, IF_FIRST);
		return;
	}
	if (anyComma(lp)) {
		const std::string srcLabel = GetDelimitedString(lp);
		if (srcLabel.empty()) {
			Error("[EMPTYTRD] Syntax error, empty label", bp, IF_FIRST);
		} else {
			memcpy(diskLabel, srcLabel.data(), std::min(static_cast<std::string::size_type>(8), srcLabel.size()));
			if (8 < srcLabel.size()) {
				Warning("[EMPTYTRD] label will be truncated to 8 characters", diskLabel);
			}
		}
	}
	TRD_SaveEmpty(fnaam, diskLabel);
}